

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

void __thiscall
spvtools::anon_unknown_0::ParsedInstruction::ParsedInstruction
          (ParsedInstruction *this,ParsedInstruction *param_1)

{
  ParsedInstruction *param_1_local;
  ParsedInstruction *this_local;
  
  memcpy(this,param_1,0x28);
  std::unique_ptr<spv_parsed_operand_t[],_std::default_delete<spv_parsed_operand_t[]>_>::unique_ptr
            (&this->operands_,&param_1->operands_);
  return;
}

Assistant:

ParsedInstruction(const spv_parsed_instruction_t* instruction) {
    // Make a copy of the parsed instruction, including stable memory for its
    // operands.
    instruction_ = *instruction;
    operands_ =
        std::make_unique<spv_parsed_operand_t[]>(instruction->num_operands);
    memcpy(operands_.get(), instruction->operands,
           instruction->num_operands * sizeof(*instruction->operands));
    instruction_.operands = operands_.get();
  }